

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::Triangle::Sample(Triangle *this,Point2f u)

{
  Point3f *pPVar1;
  Normal3f *pNVar2;
  Tuple2<pbrt::Point2,_float> t;
  Tuple2<pbrt::Point2,_float> t_00;
  Tuple2<pbrt::Point2,_float> t_01;
  Point3<float> p_00;
  Point2f uv_00;
  Point3<float> c;
  Point3<float> p_01;
  Point3<float> p_02;
  Normal3<float> c_00;
  Normal3<float> c_01;
  Tuple3<pbrt::Point3,_float> t_02;
  Tuple3<pbrt::Point3,_float> t_03;
  Point3<float> c_02;
  Tuple3<pbrt::Point3,_float> t_04;
  Point3<float> c_03;
  Vector3<float> w;
  Tuple3<pbrt::Point3,_float> t_05;
  Tuple3<pbrt::Point3,_float> t_06;
  Tuple3<pbrt::Point3,_float> t_07;
  Tuple3<pbrt::Normal3,_float> t_08;
  Tuple3<pbrt::Normal3,_float> t_09;
  Tuple3<pbrt::Normal3,_float> t_10;
  Tuple3<pbrt::Point3,_float> t_11;
  Tuple3<pbrt::Point3,_float> t_12;
  Tuple3<pbrt::Point3,_float> t_13;
  Tuple3<pbrt::Point3,_float> t_14;
  Vector3f e;
  Normal3f n_00;
  Point2f u_00;
  Vector3<float> v_00;
  Point3f p_03;
  initializer_list<pbrt::Point2<float>_> v_01;
  initializer_list<pbrt::Point2<float>_> v_02;
  Normal3<float> n2;
  Normal3<float> n_01;
  float *pfVar3;
  long in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar34 [56];
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar33 [64];
  array<float,_3> aVar35;
  Point3<float> PVar36;
  Vector3<float> VVar37;
  Normal3<float> NVar38;
  Vector3f pError;
  Point3f pAbsSum;
  Point2f uvSample;
  array<pbrt::Point2<float>,_3> uv;
  Normal3f ns;
  Normal3f n;
  Point3f p;
  array<float,_3> b;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  float in_stack_fffffffffffff798;
  float in_stack_fffffffffffff79c;
  undefined4 in_stack_fffffffffffff7a0;
  float fVar39;
  undefined4 in_stack_fffffffffffff7a4;
  float fVar40;
  undefined4 in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7ac;
  Tuple2<pbrt::Point2,_float> c_04;
  undefined4 in_stack_fffffffffffff7b0;
  float fVar41;
  float in_stack_fffffffffffff7b4;
  float s;
  undefined4 in_stack_fffffffffffff7c0;
  undefined4 uVar42;
  undefined4 in_stack_fffffffffffff7c4;
  undefined4 uVar43;
  float in_stack_fffffffffffff7c8;
  float in_stack_fffffffffffff7cc;
  float in_stack_fffffffffffff7d0;
  float fVar44;
  float in_stack_fffffffffffff7d4;
  undefined4 uVar45;
  float in_stack_fffffffffffff7d8;
  array<pbrt::Point2<float>,_3> *in_stack_fffffffffffff7e0;
  float in_stack_fffffffffffff7e8;
  undefined4 in_stack_fffffffffffff7ec;
  float in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  array<float,_3> *this_00;
  undefined4 in_stack_fffffffffffff800;
  array<float,_3> *paVar46;
  float in_stack_fffffffffffff828;
  Triangle *in_stack_fffffffffffff8b0;
  undefined1 local_488 [24];
  undefined1 *local_470;
  undefined8 local_468;
  Tuple2<pbrt::Point2,_float> local_460;
  Tuple2<pbrt::Point2,_float> local_458;
  Tuple2<pbrt::Point2,_float> local_450;
  Tuple2<pbrt::Point2,_float> *local_448;
  undefined8 local_440;
  undefined1 local_438 [24];
  undefined8 local_420;
  float local_418;
  undefined8 local_410;
  float local_408;
  undefined8 local_400;
  float local_3f8;
  undefined8 local_3f0;
  float local_3e8;
  undefined8 local_3e0;
  float local_3d8;
  undefined8 local_3d4;
  float local_3cc;
  undefined8 local_3c8;
  float local_3c0;
  undefined8 local_3b8;
  float local_3b0;
  undefined8 local_3a8;
  float local_3a0;
  undefined8 local_398;
  float local_390;
  undefined8 local_388;
  float local_380;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  undefined8 local_358;
  float local_350;
  undefined8 local_348;
  float local_340;
  undefined8 local_338;
  float local_330;
  undefined8 local_328;
  float local_320;
  undefined8 local_318;
  float local_310;
  undefined8 local_308;
  float local_300;
  undefined8 local_2f8;
  float local_2f0;
  undefined8 local_2e8;
  float local_2e0;
  undefined8 local_2d8;
  float local_2d0;
  undefined8 local_2c8;
  float local_2c0;
  undefined8 local_2b8;
  float local_2b0;
  undefined8 local_2a8;
  float local_2a0;
  undefined8 local_298;
  undefined4 local_290;
  undefined8 local_288;
  float local_280;
  undefined8 local_278;
  float local_270;
  undefined8 local_268;
  float local_260;
  undefined8 local_258;
  float local_250;
  undefined8 local_248;
  float local_240;
  undefined8 local_238;
  float local_230;
  undefined8 local_228;
  float local_220;
  undefined8 local_218;
  float local_210;
  undefined8 local_208;
  float local_200;
  undefined8 local_1f8;
  float local_1f0;
  undefined8 local_1e8;
  float local_1e0;
  undefined8 local_1d8;
  float local_1d0;
  undefined8 local_1c8;
  float local_1c0;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined8 local_1ac;
  float local_1a4;
  undefined8 local_1a0;
  float local_198;
  undefined8 local_190;
  float local_188;
  undefined8 local_180;
  float local_178;
  undefined8 local_170;
  float local_168;
  undefined8 local_160;
  float local_158;
  undefined8 local_150;
  float local_148;
  undefined8 local_140;
  float local_138;
  undefined8 local_130;
  float local_128;
  undefined8 local_120;
  float local_118;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_a0;
  float local_98;
  undefined8 local_90;
  float local_88;
  float local_80 [2];
  float local_78;
  undefined8 local_70;
  array<float,_3> local_68;
  undefined8 local_58;
  float local_50;
  undefined8 local_48;
  float local_40;
  undefined8 local_38;
  float local_30;
  int *local_28;
  TriangleMesh *local_20;
  undefined8 local_10;
  undefined1 auVar5 [64];
  undefined1 auVar10 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  fVar39 = SUB84(in_RDI,0);
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  local_20 = GetMesh((Triangle *)0x8c25e2);
  local_28 = local_20->vertexIndices + *(int *)(in_RSI + 4) * 3;
  local_30 = local_20->p[*local_28].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + *local_28;
  local_38._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_38._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_40 = local_20->p[local_28[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + local_28[1];
  local_48._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_48._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_50 = local_20->p[local_28[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar1 = local_20->p + local_28[2];
  local_58._0_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).x;
  local_58._4_4_ = (pPVar1->super_Tuple3<pbrt::Point3,_float>).y;
  local_70 = local_10;
  auVar34 = ZEXT856(0);
  u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff7d8;
  u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff7d4;
  aVar35 = SampleUniformTriangle(u_00);
  local_78 = aVar35.values[2];
  auVar4._0_8_ = aVar35.values._0_8_;
  auVar4._8_56_ = auVar34;
  local_80 = (float  [2])vmovlpd_avx(auVar4._0_16_);
  paVar46 = &local_68;
  local_68.values._0_8_ = local_80;
  local_68.values[2] = local_78;
  pstd::array<float,_3>::operator[](paVar46,0);
  auVar34 = (undefined1  [56])0x0;
  local_b8 = local_30;
  local_c0 = local_38;
  local_c8 = local_30;
  local_d0 = local_38;
  t_05.y = in_stack_fffffffffffff7cc;
  t_05.x = in_stack_fffffffffffff7c8;
  t_05.z = in_stack_fffffffffffff7d0;
  PVar36 = pbrt::operator*(in_stack_fffffffffffff7b4,t_05);
  local_d8 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar34;
  local_e0 = vmovlpd_avx(auVar5._0_16_);
  local_b0 = local_e0;
  local_a8 = local_d8;
  pstd::array<float,_3>::operator[](paVar46,1);
  auVar34 = (undefined1  [56])0x0;
  local_f8 = local_40;
  local_100 = local_48;
  local_108 = local_40;
  local_110 = local_48;
  t_06.y = in_stack_fffffffffffff7cc;
  t_06.x = in_stack_fffffffffffff7c8;
  t_06.z = in_stack_fffffffffffff7d0;
  PVar36 = pbrt::operator*(in_stack_fffffffffffff7b4,t_06);
  local_128 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar6._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar34;
  local_130 = vmovlpd_avx(auVar6._0_16_);
  auVar34 = ZEXT856(0);
  PVar36.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff7c4;
  PVar36.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff7c0;
  PVar36.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7c8;
  local_120 = local_130;
  local_118 = local_128;
  local_f0 = local_130;
  local_e8 = local_128;
  PVar36 = Tuple3<pbrt::Point3,float>::operator+
                     ((Tuple3<pbrt::Point3,_float> *)
                      CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),PVar36);
  local_138 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar34;
  local_140 = vmovlpd_avx(auVar7._0_16_);
  local_a0 = local_140;
  local_98 = local_138;
  pstd::array<float,_3>::operator[](paVar46,2);
  auVar34 = (undefined1  [56])0x0;
  local_158 = local_50;
  local_160 = local_58;
  local_168 = local_50;
  local_170 = local_58;
  t_07.y = in_stack_fffffffffffff7cc;
  t_07.x = in_stack_fffffffffffff7c8;
  t_07.z = in_stack_fffffffffffff7d0;
  PVar36 = pbrt::operator*(in_stack_fffffffffffff7b4,t_07);
  local_188 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar34;
  local_190 = vmovlpd_avx(auVar8._0_16_);
  auVar34 = ZEXT856(0);
  c.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff7c4;
  c.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff7c0;
  c.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7c8;
  local_180 = local_190;
  local_178 = local_188;
  local_150 = local_190;
  local_148 = local_188;
  PVar36 = Tuple3<pbrt::Point3,float>::operator+
                     ((Tuple3<pbrt::Point3,_float> *)
                      CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),c);
  local_198 = PVar36.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar34;
  local_1a0 = vmovlpd_avx(auVar9._0_16_);
  local_1e0 = local_30;
  local_1e8 = local_38;
  local_1f0 = local_30;
  local_1f8 = local_38;
  auVar34 = ZEXT856(0);
  p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff7c4;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff7c0;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7c8;
  local_90 = local_1a0;
  local_88 = local_198;
  VVar37 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                      ,p_01);
  local_200 = VVar37.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar37.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar34;
  local_208 = vmovlpd_avx(auVar10._0_16_);
  local_220 = local_30;
  local_228 = local_38;
  local_230 = local_30;
  local_238 = local_38;
  auVar34 = ZEXT856(0);
  p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff7c4;
  p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff7c0;
  p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff7c8;
  local_1d8 = local_208;
  local_1d0 = local_200;
  VVar37 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                      ,p_02);
  local_260 = VVar37.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar37.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar34;
  local_268 = vmovlpd_avx(auVar11._0_16_);
  local_250 = local_1d0;
  local_258 = local_1d8;
  auVar34 = ZEXT856(0);
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7e8;
  v_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff7e0;
  w.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff7c8;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff7c4;
  w.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7cc;
  local_248 = local_268;
  local_240 = local_260;
  local_218 = local_268;
  local_210 = local_260;
  VVar37 = Cross<float>(v_00,w);
  local_280 = VVar37.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar12._0_8_ = VVar37.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar34;
  local_288 = vmovlpd_avx(auVar12._0_16_);
  VVar37.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffff7b0;
  VVar37.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff7ac;
  VVar37.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff7b4;
  local_278 = local_288;
  local_270 = local_280;
  local_1c8 = local_288;
  local_1c0 = local_280;
  Normal3<float>::Normal3<float>((Normal3<float> *)0x8c2b8f,VVar37);
  local_290 = local_1b0;
  local_298 = local_1b8;
  auVar34 = ZEXT856(0);
  NVar38.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff7ec;
  NVar38.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffff7e8;
  NVar38.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff7f0;
  NVar38 = Normalize<float>(NVar38);
  local_2a0 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar13._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar13._8_56_ = auVar34;
  local_2a8 = vmovlpd_avx(auVar13._0_16_);
  local_1ac = local_2a8;
  local_1a4 = local_2a0;
  if (local_20->n == (Normal3f *)0x0) {
    if ((local_20->reverseOrientation & 1U) != (local_20->transformSwapsHandedness & 1U)) {
      Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_1ac,-1);
    }
    this_00 = (array<float,_3> *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0);
  }
  else {
    in_stack_fffffffffffff7e8 = 0.0;
    in_stack_fffffffffffff7ec = 0;
    this_00 = &local_68;
    pstd::array<float,_3>::operator[](this_00,0);
    auVar34 = (undefined1  [56])0x0;
    local_2f0 = local_20->n[*local_28].super_Tuple3<pbrt::Normal3,_float>.z;
    pNVar2 = local_20->n + *local_28;
    local_2f8._0_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).x;
    local_2f8._4_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).y;
    t_08.y = in_stack_fffffffffffff7cc;
    t_08.x = in_stack_fffffffffffff7c8;
    t_08.z = in_stack_fffffffffffff7d0;
    local_2e8 = local_2f8;
    local_2e0 = local_2f0;
    NVar38 = pbrt::operator*(in_stack_fffffffffffff7b4,t_08);
    local_300 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar14._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar14._8_56_ = auVar34;
    local_308 = vmovlpd_avx(auVar14._0_16_);
    local_2d8 = local_308;
    local_2d0 = local_300;
    pstd::array<float,_3>::operator[](this_00,1);
    auVar34 = (undefined1  [56])0x0;
    local_330 = local_20->n[local_28[1]].super_Tuple3<pbrt::Normal3,_float>.z;
    pNVar2 = local_20->n + local_28[1];
    local_338._0_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).x;
    local_338._4_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).y;
    t_09.y = in_stack_fffffffffffff7cc;
    t_09.x = in_stack_fffffffffffff7c8;
    t_09.z = in_stack_fffffffffffff7d0;
    local_328 = local_338;
    local_320 = local_330;
    NVar38 = pbrt::operator*(in_stack_fffffffffffff7b4,t_09);
    local_350 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar15._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar15._8_56_ = auVar34;
    local_358 = vmovlpd_avx(auVar15._0_16_);
    auVar34 = ZEXT856(0);
    c_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff7c4;
    c_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff7c0;
    c_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff7c8;
    local_348 = local_358;
    local_340 = local_350;
    local_318 = local_358;
    local_310 = local_350;
    NVar38 = Tuple3<pbrt::Normal3,float>::operator+
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),c_00);
    local_360 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar16._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar16._8_56_ = auVar34;
    local_368 = vmovlpd_avx(auVar16._0_16_);
    local_2c8 = local_368;
    local_2c0 = local_360;
    pfVar3 = pstd::array<float,_3>::operator[]
                       (this_00,CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8));
    fVar40 = 1.0 - *pfVar3;
    pstd::array<float,_3>::operator[](this_00,1);
    auVar34 = (undefined1  [56])0x0;
    local_390 = local_20->n[local_28[2]].super_Tuple3<pbrt::Normal3,_float>.z;
    pNVar2 = local_20->n + local_28[2];
    local_398._0_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).x;
    local_398._4_4_ = (pNVar2->super_Tuple3<pbrt::Normal3,_float>).y;
    t_10.y = in_stack_fffffffffffff7cc;
    t_10.x = in_stack_fffffffffffff7c8;
    t_10.z = in_stack_fffffffffffff7d0;
    local_388 = local_398;
    local_380 = local_390;
    NVar38 = pbrt::operator*(in_stack_fffffffffffff7b4,t_10);
    local_3b0 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar17._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar17._8_56_ = auVar34;
    local_3b8 = vmovlpd_avx(auVar17._0_16_);
    auVar34 = ZEXT856(0);
    c_01.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff7c4;
    c_01.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff7c0;
    c_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff7c8;
    local_3a8 = local_3b8;
    local_3a0 = local_3b0;
    local_378 = local_3b8;
    local_370 = local_3b0;
    NVar38 = Tuple3<pbrt::Normal3,float>::operator+
                       ((Tuple3<pbrt::Normal3,_float> *)
                        CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),c_01);
    local_408 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar18._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar18._8_56_ = auVar34;
    local_410 = vmovlpd_avx(auVar18._0_16_);
    local_3d8 = local_1a4;
    local_3e0 = local_1ac;
    local_3f8 = local_1a4;
    local_400 = local_1ac;
    auVar34 = ZEXT856(0);
    n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff828;
    n_01.super_Tuple3<pbrt::Normal3,_float>._0_8_ = paVar46;
    n2.super_Tuple3<pbrt::Normal3,_float>.y = fVar40;
    n2.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff800;
    n2.super_Tuple3<pbrt::Normal3,_float>.z = fVar39;
    local_3f0 = local_410;
    local_3e8 = local_408;
    local_3c8 = local_410;
    local_3c0 = local_408;
    local_2b8 = local_410;
    local_2b0 = local_408;
    NVar38 = FaceForward<float>(n_01,n2);
    local_418 = NVar38.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar19._0_8_ = NVar38.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar19._8_56_ = auVar34;
    local_420 = vmovlpd_avx(auVar19._0_16_);
    local_3d4 = local_420;
    local_3cc = local_418;
    local_1ac = local_420;
    local_1a4 = local_418;
  }
  if (local_20->uv == (Point2f *)0x0) {
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
               in_stack_fffffffffffff79c,in_stack_fffffffffffff798);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
               in_stack_fffffffffffff79c,in_stack_fffffffffffff798);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
               in_stack_fffffffffffff79c,in_stack_fffffffffffff798);
    local_470 = local_488;
    local_468 = 3;
    v_02._M_array._4_4_ = in_stack_fffffffffffff7ec;
    v_02._M_array._0_4_ = in_stack_fffffffffffff7e8;
    v_02._M_len._0_4_ = (int)this_00;
    v_02._M_len._4_4_ = (int)((ulong)this_00 >> 0x20);
    pstd::array<pbrt::Point2<float>,_3>::array(in_stack_fffffffffffff7e0,v_02);
  }
  else {
    local_460 = local_20->uv[*local_28].super_Tuple2<pbrt::Point2,_float>;
    local_458 = local_20->uv[local_28[1]].super_Tuple2<pbrt::Point2,_float>;
    local_450 = local_20->uv[local_28[2]].super_Tuple2<pbrt::Point2,_float>;
    local_448 = &local_460;
    local_440 = 3;
    v_01._M_array._4_4_ = in_stack_fffffffffffff7ec;
    v_01._M_array._0_4_ = in_stack_fffffffffffff7e8;
    v_01._M_len._0_4_ = (int)this_00;
    v_01._M_len._4_4_ = (int)((ulong)this_00 >> 0x20);
    pstd::array<pbrt::Point2<float>,_3>::array(in_stack_fffffffffffff7e0,v_01);
  }
  uVar42 = 0;
  uVar43 = 0;
  paVar46 = &local_68;
  pfVar3 = pstd::array<float,_3>::operator[](paVar46,0);
  fVar39 = *pfVar3;
  c_04 = (Tuple2<pbrt::Point2,_float>)local_438;
  pstd::array<pbrt::Point2<float>,_3>::operator[]
            ((array<pbrt::Point2<float>,_3> *)c_04,CONCAT44(uVar43,uVar42));
  t.y = in_stack_fffffffffffff79c;
  t.x = in_stack_fffffffffffff798;
  auVar20._0_8_ = pbrt::operator*(0.0,t);
  auVar20._8_56_ = extraout_var;
  vmovlpd_avx(auVar20._0_16_);
  fVar44 = 1.4013e-45;
  uVar45 = 0;
  pfVar3 = pstd::array<float,_3>::operator[](paVar46,1);
  fVar40 = *pfVar3;
  pstd::array<pbrt::Point2<float>,_3>::operator[]
            ((array<pbrt::Point2<float>,_3> *)c_04,CONCAT44(uVar45,fVar44));
  t_00.y = in_stack_fffffffffffff79c;
  t_00.x = in_stack_fffffffffffff798;
  auVar21._0_8_ = pbrt::operator*(0.0,t_00);
  auVar21._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar21._0_16_);
  auVar22._0_8_ =
       Tuple2<pbrt::Point2,float>::operator+
                 ((Tuple2<pbrt::Point2,_float> *)CONCAT44(fVar40,fVar39),c_04);
  auVar22._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar22._0_16_);
  fVar41 = 2.8026e-45;
  s = 0.0;
  pstd::array<float,_3>::operator[](paVar46,2);
  pstd::array<pbrt::Point2<float>,_3>::operator[]
            ((array<pbrt::Point2<float>,_3> *)c_04,CONCAT44(s,fVar41));
  t_01.y = in_stack_fffffffffffff79c;
  t_01.x = in_stack_fffffffffffff798;
  auVar23._0_8_ = pbrt::operator*(0.0,t_01);
  auVar23._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar23._0_16_);
  auVar24._0_8_ =
       Tuple2<pbrt::Point2,float>::operator+
                 ((Tuple2<pbrt::Point2,_float> *)CONCAT44(fVar40,fVar39),c_04);
  auVar24._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar24._0_16_);
  pstd::array<float,_3>::operator[](paVar46,CONCAT44(uVar43,uVar42));
  auVar34 = (undefined1  [56])0x0;
  t_11.z = fVar44;
  t_11._0_8_ = paVar46;
  PVar36 = pbrt::operator*(s,t_11);
  auVar25._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar25._8_56_ = auVar34;
  vmovlpd_avx(auVar25._0_16_);
  auVar34 = ZEXT856(0);
  t_02.y = (float)uVar43;
  t_02.x = (float)uVar42;
  t_02.z = SUB84(paVar46,0);
  PVar36 = Abs<pbrt::Point3,float>(t_02);
  auVar26._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar26._8_56_ = auVar34;
  vmovlpd_avx(auVar26._0_16_);
  pstd::array<float,_3>::operator[](paVar46,CONCAT44(uVar45,fVar44));
  auVar34 = (undefined1  [56])0x0;
  t_12.z = fVar44;
  t_12._0_8_ = paVar46;
  PVar36 = pbrt::operator*(s,t_12);
  auVar27._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar27._8_56_ = auVar34;
  vmovlpd_avx(auVar27._0_16_);
  auVar34 = ZEXT856(0);
  t_03.y = (float)uVar43;
  t_03.x = (float)uVar42;
  t_03.z = SUB84(paVar46,0);
  PVar36 = Abs<pbrt::Point3,float>(t_03);
  auVar28._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar28._8_56_ = auVar34;
  vmovlpd_avx(auVar28._0_16_);
  auVar34 = ZEXT856(0);
  c_02.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar43;
  c_02.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar42;
  c_02.super_Tuple3<pbrt::Point3,_float>.z = SUB84(paVar46,0);
  PVar36 = Tuple3<pbrt::Point3,float>::operator+((Tuple3<pbrt::Point3,_float> *)c_04,c_02);
  auVar29._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar29._8_56_ = auVar34;
  vmovlpd_avx(auVar29._0_16_);
  pstd::array<float,_3>::operator[](paVar46,CONCAT44(uVar43,uVar42));
  pstd::array<float,_3>::operator[](paVar46,CONCAT44(uVar45,fVar44));
  auVar34 = (undefined1  [56])0x0;
  t_13.z = fVar44;
  t_13._0_8_ = paVar46;
  PVar36 = pbrt::operator*(s,t_13);
  auVar30._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar30._8_56_ = auVar34;
  vmovlpd_avx(auVar30._0_16_);
  auVar34 = ZEXT856(0);
  t_04.y = (float)uVar43;
  t_04.x = (float)uVar42;
  t_04.z = SUB84(paVar46,0);
  PVar36 = Abs<pbrt::Point3,float>(t_04);
  auVar31._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar34;
  vmovlpd_avx(auVar31._0_16_);
  auVar34 = ZEXT856(0);
  c_03.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar43;
  c_03.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar42;
  c_03.super_Tuple3<pbrt::Point3,_float>.z = SUB84(paVar46,0);
  PVar36 = Tuple3<pbrt::Point3,float>::operator+((Tuple3<pbrt::Point3,_float> *)c_04,c_03);
  auVar32._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar32._8_56_ = auVar34;
  vmovlpd_avx(auVar32._0_16_);
  pbrt::gamma(auVar32._0_8_);
  t_14.z = fVar44;
  t_14._0_8_ = paVar46;
  auVar34 = extraout_var_04;
  PVar36 = pbrt::operator*(s,t_14);
  auVar33._0_8_ = PVar36.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar33._8_56_ = auVar34;
  vmovlpd_avx(auVar33._0_16_);
  p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar41;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = c_04.y;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = s;
  Vector3<float>::Vector3<float>((Vector3<float> *)0x8c37fc,p_00);
  p_03.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff7ec;
  p_03.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff7e8;
  p_03.super_Tuple3<pbrt::Point3,_float>.z = SUB84(this_00,0);
  e.super_Tuple3<pbrt::Vector3,_float>.z = fVar44;
  e.super_Tuple3<pbrt::Vector3,_float>._0_8_ = paVar46;
  Point3fi::Point3fi((Point3fi *)CONCAT44(s,fVar41),p_03,e);
  n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar44;
  n_00.super_Tuple3<pbrt::Normal3,_float>._0_8_ = paVar46;
  uv_00.super_Tuple2<pbrt::Point2,_float>.y = s;
  uv_00.super_Tuple2<pbrt::Point2,_float>.x = fVar41;
  Interaction::Interaction((Interaction *)c_04,(Point3fi *)CONCAT44(fVar40,fVar39),n_00,uv_00);
  Area(in_stack_fffffffffffff8b0);
  pstd::optional<pbrt::ShapeSample>::optional
            ((optional<pbrt::ShapeSample> *)CONCAT44(fVar40,fVar39),
             (ShapeSample *)CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798));
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Sample point on triangle uniformly by area
        pstd::array<Float, 3> b = SampleUniformTriangle(u);
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;

        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute $(u,v)$ for sampled point on triangle
        // Get triangle texture coordinates in _uv_ array
        pstd::array<Point2f, 3> uv =
            mesh->uv
                ? pstd::array<Point2f, 3>(
                      {mesh->uv[v[0]], mesh->uv[v[1]], mesh->uv[v[2]]})
                : pstd::array<Point2f, 3>({Point2f(0, 0), Point2f(1, 0), Point2f(1, 1)});

        Point2f uvSample = b[0] * uv[0] + b[1] * uv[1] + b[2] * uv[2];

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        return ShapeSample{Interaction(Point3fi(p, pError), n, uvSample), 1 / Area()};
    }